

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

bool __thiscall
despot::Chain::Step(Chain *this,State *s,double random_num,ACT_TYPE action,double *reward,
                   OBS_TYPE *obs)

{
  int iVar1;
  double dVar2;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  ChainState::GetTransition
            ((vector<double,_std::allocator<double>_> *)&local_40,(ChainState *)s,*(int *)(s + 0x38)
             ,action);
  iVar1 = despot::Random::GetCategory((vector *)&local_40,random_num);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  if (iVar1 == 0) {
    dVar2 = 2.0;
  }
  else if (*(int *)(s + 0x38) == 4 && iVar1 == 4) {
    dVar2 = 10.0;
  }
  else {
    dVar2 = 0.0;
  }
  *reward = dVar2;
  *(int *)(s + 0x38) = iVar1;
  *obs = (long)iVar1;
  return false;
}

Assistant:

bool Chain::Step(State& s, double random_num, ACT_TYPE action, double &reward,
	OBS_TYPE &obs) const {
	ChainState& state = static_cast<ChainState&>(s);
	int next = Random::GetCategory(state.GetTransition(state.mdp_state, action),
		random_num);
	reward = Reward(state.mdp_state, action, next);
	state.mdp_state = next;
	obs = state.mdp_state;

	return false;
}